

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

char * Acb_RemapOneFunction(char *pStr,Vec_Int_t *vSupp,Vec_Int_t *vMap,int nVars)

{
  char cVar1;
  Vec_Str_t *p;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar2 = (char *)malloc(100);
  p->pArray = pcVar2;
  pcVar2 = strtok(pStr,"\n");
  if (pcVar2 != (char *)0x0) {
LAB_0037652a:
    iVar5 = nVars;
    if (0 < nVars) {
      do {
        uVar7 = p->nSize;
        if (uVar7 == p->nCap) {
          if ((int)uVar7 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(0x10);
            }
            else {
              pcVar3 = (char *)realloc(p->pArray,0x10);
            }
            p->pArray = pcVar3;
            p->nCap = 0x10;
          }
          else {
            sVar8 = (ulong)uVar7 * 2;
            if (p->pArray == (char *)0x0) {
              pcVar3 = (char *)malloc(sVar8);
            }
            else {
              pcVar3 = (char *)realloc(p->pArray,sVar8);
            }
            p->pArray = pcVar3;
            p->nCap = (int)sVar8;
          }
        }
        else {
          pcVar3 = p->pArray;
        }
        p->nSize = uVar7 + 1;
        pcVar3[(int)uVar7] = '-';
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    lVar4 = 0;
    do {
      cVar1 = pcVar2[lVar4];
      if (cVar1 != '-') {
        if (cVar1 == ' ') goto LAB_0037662e;
        if (vSupp->nSize <= lVar4) {
LAB_003766d4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = vSupp->pArray[lVar4];
        if (((long)iVar5 < 0) || (vMap->nSize <= iVar5)) goto LAB_003766d4;
        iVar5 = vMap->pArray[iVar5];
        if ((iVar5 < 0) || (nVars <= iVar5)) {
          __assert_fail("iVar >= 0 && iVar < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                        ,0x8b0,"char *Acb_RemapOneFunction(char *, Vec_Int_t *, Vec_Int_t *, int)");
        }
        uVar7 = (p->nSize - nVars) + iVar5;
        if (((int)uVar7 < 0) || (p->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        p->pArray[uVar7] = cVar1;
      }
      lVar4 = lVar4 + 1;
    } while( true );
  }
  uVar6 = 0;
LAB_00376683:
  pcVar2 = p->pArray;
LAB_003766af:
  pcVar2[(int)uVar6] = '\0';
  pcVar2 = p->pArray;
  free(p);
  return pcVar2;
LAB_0037662e:
  Vec_StrPrintF(p," %d\n",(ulong)((int)pcVar2[(int)lVar4 + 1] - 0x30));
  pcVar2 = strtok((char *)0x0,"\n");
  if (pcVar2 == (char *)0x0) goto code_r0x00376663;
  goto LAB_0037652a;
code_r0x00376663:
  uVar7 = p->nCap;
  uVar6 = p->nSize;
  if (uVar6 == uVar7) {
    if ((int)uVar7 < 0x10) {
      pcVar2 = p->pArray;
      if (pcVar2 == (char *)0x0) {
        sVar8 = 0x10;
        goto LAB_003766a6;
      }
      sVar8 = 0x10;
LAB_00376695:
      pcVar2 = (char *)realloc(pcVar2,sVar8);
    }
    else {
      sVar8 = (ulong)uVar7 * 2;
      pcVar2 = p->pArray;
      if (pcVar2 != (char *)0x0) goto LAB_00376695;
LAB_003766a6:
      pcVar2 = (char *)malloc(sVar8);
    }
    p->pArray = pcVar2;
    goto LAB_003766af;
  }
  goto LAB_00376683;
}

Assistant:

char * Acb_RemapOneFunction( char * pStr, Vec_Int_t * vSupp, Vec_Int_t * vMap, int nVars )
{
    Vec_Str_t * vTempSop = Vec_StrAlloc( 100 );
    char * pToken = strtok( pStr, "\n" );  int i; 
    while ( pToken != NULL )
    {
        for ( i = 0; i < nVars; i++ )
            Vec_StrPush( vTempSop, '-' );
        for ( i = 0; pToken[i] != ' '; i++ )
            if ( pToken[i] != '-' )
            {
                int iVar = Vec_IntEntry( vMap, Vec_IntEntry(vSupp, i) );
                assert( iVar >= 0 && iVar < nVars );
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - nVars + iVar, pToken[i] );
            }
        Vec_StrPrintF( vTempSop, " %d\n", pToken[i+1] - '0' );
        pToken = strtok( NULL, "\n" );
    }
    Vec_StrPush( vTempSop, '\0' );
    pToken = Vec_StrReleaseArray(vTempSop);
    Vec_StrFree( vTempSop );
    return pToken;
}